

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spC<PredictionData<float,int>>
                 (PredictionData<float,_int> *prediction_data,size_t row,size_t col_num)

{
  int *piVar1;
  unsigned_long *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *search_res;
  double local_8;
  
  piVar1 = std::lower_bound<int*,unsigned_long>(in_RDI,in_RSI,in_RDX);
  if ((piVar1 == (int *)(*(long *)(in_RDI + 0xe) +
                        (long)*(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)in_RDX * 4) * 4)) ||
     (*piVar1 != (int)in_RSI)) {
    local_8 = 0.0;
  }
  else {
    local_8 = (double)*(float *)(*(long *)(in_RDI + 0xc) +
                                ((long)piVar1 - *(long *)(in_RDI + 0xe) >> 2) * 4);
  }
  return local_8;
}

Assistant:

double extract_spC(const PredictionData &prediction_data, size_t row, size_t col_num) noexcept
{
    const decltype(prediction_data.Xc_indptr)
               search_res = std::lower_bound(prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num],
                                             prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1],
                                             row);
    if (
        search_res == (prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1])
            ||
        (*search_res) != static_cast<typename std::remove_pointer<decltype(search_res)>::type>(row)
        )
        return 0.;
    else
        return prediction_data.Xc[search_res - prediction_data.Xc_ind];
}